

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_decompressStream(ZSTD_DStream *zds,ZSTD_outBuffer *output,ZSTD_inBuffer *input)

{
  size_t *psVar1;
  BYTE *src;
  void *src_00;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  void *pvVar7;
  ZSTD_allocFunction p_Var8;
  void *pvVar9;
  ZSTD_nextInputType_e ZVar10;
  ZSTD_DDict *pZVar11;
  char *pcVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  ulong uVar16;
  bool bVar17;
  ZSTD_dStage ZVar18;
  void *pvVar19;
  ulong uVar20;
  void *src_01;
  ulong uVar21;
  size_t inputSize;
  ulong uVar22;
  ulong uVar23;
  ZSTD_frameSizeInfo ZVar24;
  void *local_c0;
  
  uVar23 = input->pos;
  uVar4 = input->size;
  sVar13 = 0xffffffffffffffb8;
  if (uVar23 <= uVar4) {
    uVar5 = output->pos;
    uVar6 = output->size;
    sVar13 = 0xffffffffffffffba;
    if (uVar5 <= uVar6) {
      src_00 = (void *)((long)input->src + uVar23);
      pvVar19 = (void *)((long)input->src + uVar4);
      pvVar7 = output->dst;
      psVar1 = &zds->outStart;
      src = zds->headerBuffer;
      bVar17 = false;
      pvVar9 = src_00;
      local_c0 = (void *)((long)pvVar7 + uVar5);
LAB_0014f8b7:
      src_01 = pvVar9;
      if (bVar17) {
        uVar16 = (long)src_01 - (long)input->src;
        input->pos = uVar16;
        output->pos = (long)local_c0 - (long)output->dst;
        if ((src_01 == src_00) && (local_c0 == (void *)((long)pvVar7 + uVar5))) {
          iVar3 = zds->noForwardProgress;
          zds->noForwardProgress = iVar3 + 1;
          if (0xe < iVar3) {
            if (uVar5 == uVar6) {
              return 0xffffffffffffffba;
            }
            if (uVar4 != uVar23) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x608c,
                            "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                           );
            }
            return 0xffffffffffffffb8;
          }
        }
        else {
          zds->noForwardProgress = 0;
        }
        sVar13 = zds->expected;
        if (sVar13 == 0) {
          if (zds->outEnd != zds->outStart) {
            if (zds->hostageByte != 0) {
              return 1;
            }
            input->pos = uVar16 - 1;
            zds->hostageByte = 1;
            return 1;
          }
          if (zds->hostageByte != 0) {
            if (input->size <= uVar16) {
              zds->streamStage = zdss_read;
              return 1;
            }
            input->pos = uVar16 + 1;
          }
          return 0;
        }
        ZVar10 = ZSTD_nextInputType(zds);
        uVar23 = (ulong)(ZVar10 == ZSTDnit_block) * 3 + sVar13;
        if (zds->inPos <= uVar23) {
          return uVar23 - zds->inPos;
        }
        __assert_fail("zds->inPos <= nextSrcSizeHint",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x60a5,
                      "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                     );
      }
      switch(zds->streamStage) {
      case zdss_init:
        zds->streamStage = zdss_loadHeader;
        zds->inPos = 0;
        zds->legacyVersion = 0;
        zds->hostageByte = 0;
        *psVar1 = 0;
        zds->outEnd = 0;
        zds->lhSize = 0;
        sVar13 = 0;
        break;
      case zdss_loadHeader:
        sVar13 = zds->lhSize;
        break;
      case zdss_read:
        goto switchD_0014f8e1_caseD_2;
      case zdss_load:
        inputSize = (long)pvVar19 - (long)src_01;
        goto LAB_0014fc57;
      case zdss_flush:
        sVar13 = zds->outStart;
        sVar15 = zds->outEnd;
        goto LAB_0014fe0c;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x6080,
                      "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                     );
      }
      sVar13 = ZSTD_getFrameHeader_advanced(&zds->fParams,src,sVar13,zds->format);
      if (0xffffffffffffff88 < sVar13) {
        return sVar13;
      }
      if (sVar13 == 0) {
        uVar16 = (zds->fParams).frameContentSize;
        if (((uVar16 != 0) && ((zds->fParams).windowSize != 0)) &&
           (uVar21 = (long)pvVar7 + (uVar6 - (long)local_c0), uVar16 <= uVar21)) {
          ZVar24 = ZSTD_findFrameSizeInfo(src_00,uVar4 - uVar23);
          uVar16 = ZVar24.compressedSize;
          if (uVar4 - uVar23 < uVar16) goto LAB_0014f9f1;
          pZVar11 = ZSTD_getDDict(zds);
          sVar13 = ZSTD_decompress_usingDDict(zds,local_c0,uVar21,src_00,uVar16,pZVar11);
          if (0xffffffffffffff88 < sVar13) {
            return sVar13;
          }
          local_c0 = (void *)((long)local_c0 + sVar13);
          zds->expected = 0;
          zds->streamStage = zdss_init;
          bVar17 = true;
          pvVar9 = (void *)(uVar16 + (long)src_00);
          goto LAB_0014f8b7;
        }
LAB_0014f9f1:
        pZVar11 = ZSTD_getDDict(zds);
        ZSTD_decompressBegin_usingDDict(zds,pZVar11);
        if ((*(uint *)zds->headerBuffer & 0xfffffff0) == 0x184d2a50) {
          uVar16 = (ulong)*(uint *)(zds->headerBuffer + 4);
          ZVar18 = ZSTDds_skipFrame;
        }
        else {
          sVar13 = ZSTD_decodeFrameHeader(zds,src,zds->lhSize);
          uVar16 = 3;
          ZVar18 = ZSTDds_decodeBlockHeader;
          if (0xffffffffffffff88 < sVar13) {
            return sVar13;
          }
        }
        zds->expected = uVar16;
        zds->stage = ZVar18;
        uVar16 = (zds->fParams).windowSize;
        if (uVar16 < 0x401) {
          uVar16 = 0x400;
        }
        (zds->fParams).windowSize = uVar16;
        if (zds->maxWindowSize < uVar16) {
          return 0xfffffffffffffff0;
        }
        uVar2 = (zds->fParams).blockSizeMax;
        uVar21 = (ulong)uVar2;
        if (uVar2 < 5) {
          uVar21 = 4;
        }
        uVar22 = (zds->fParams).frameContentSize;
        uVar20 = 0x20000;
        if (uVar16 < 0x20000) {
          uVar20 = uVar16;
        }
        uVar16 = uVar16 + uVar20 + 0x40;
        if (uVar16 < uVar22) {
          uVar22 = uVar16;
        }
        uVar16 = uVar21 + uVar22;
        if (zds->outBuffSize + zds->inBuffSize < uVar16 * 3) {
          uVar20 = 0;
        }
        else {
          uVar20 = zds->oversizedDuration + 1;
        }
        zds->oversizedDuration = uVar20;
        if ((zds->inBuffSize < uVar21) || (zds->outBuffSize < uVar22 || 0x7f < uVar20)) {
          uVar20 = zds->staticSize;
          if (uVar20 == 0) {
            ZSTD_free(zds->inBuff,zds->customMem);
            zds->inBuffSize = 0;
            zds->outBuffSize = 0;
            p_Var8 = (zds->customMem).customAlloc;
            if (p_Var8 == (ZSTD_allocFunction)0x0) {
              pcVar12 = (char *)malloc(uVar16);
            }
            else {
              pcVar12 = (char *)(*p_Var8)((zds->customMem).opaque,uVar16);
            }
            zds->inBuff = pcVar12;
            if (pcVar12 == (char *)0x0) {
              return 0xffffffffffffffc0;
            }
          }
          else {
            if (uVar20 < 0x27218) {
              __assert_fail("zds->staticSize >= sizeof(ZSTD_DCtx)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x6021,
                            "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                           );
            }
            if (uVar20 - 0x27218 < uVar16) {
              return 0xffffffffffffffc0;
            }
            pcVar12 = zds->inBuff;
          }
          zds->inBuffSize = uVar21;
          zds->outBuff = pcVar12 + uVar21;
          zds->outBuffSize = uVar22;
        }
        zds->streamStage = zdss_read;
switchD_0014f8e1_caseD_2:
        inputSize = (long)pvVar19 - (long)src_01;
        sVar13 = ZSTD_nextSrcSizeToDecompressWithInputSize(zds,inputSize);
        if (sVar13 == 0) {
          zds->streamStage = zdss_init;
          bVar17 = true;
          pvVar9 = src_01;
          goto LAB_0014f8b7;
        }
        if (sVar13 <= inputSize) {
          ZVar18 = zds->stage;
          if (ZVar18 == ZSTDds_skipFrame) {
            sVar15 = 0;
          }
          else {
            sVar15 = zds->outBuffSize - zds->outStart;
          }
          sVar15 = ZSTD_decompressContinue(zds,zds->outBuff + zds->outStart,sVar15,src_01,sVar13);
          if (0xffffffffffffff88 < sVar15) {
            return sVar15;
          }
          src_01 = (void *)((long)src_01 + sVar13);
          if ((ZVar18 == ZSTDds_skipFrame) || (bVar17 = false, pvVar9 = src_01, sVar15 != 0)) {
            zds->outEnd = zds->outStart + sVar15;
            zds->streamStage = zdss_flush;
            goto LAB_0014fde7;
          }
          goto LAB_0014f8b7;
        }
        bVar17 = true;
        pvVar9 = pvVar19;
        if (src_01 == pvVar19) goto LAB_0014f8b7;
        zds->streamStage = zdss_load;
LAB_0014fc57:
        sVar13 = zds->expected;
        sVar15 = zds->inPos;
        ZVar18 = zds->stage;
        sVar14 = ZSTD_nextSrcSizeToDecompressWithInputSize(zds,inputSize);
        if (sVar13 != sVar14) {
          __assert_fail("neededInSize == ZSTD_nextSrcSizeToDecompressWithInputSize(zds, iend - ip)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x6052,
                        "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                       );
        }
        uVar16 = sVar13 - sVar15;
        if (ZVar18 == ZSTDds_skipFrame) {
          if (uVar16 < inputSize) {
            inputSize = uVar16;
          }
        }
        else {
          if (zds->inBuffSize - sVar15 < uVar16) {
            return 0xffffffffffffffec;
          }
          if (uVar16 < inputSize) {
            inputSize = uVar16;
          }
          if (inputSize == 0) {
            inputSize = 0;
          }
          else {
            memcpy(zds->inBuff + sVar15,src_01,inputSize);
            sVar15 = zds->inPos;
          }
        }
        src_01 = (void *)((long)src_01 + inputSize);
        zds->inPos = sVar15 + inputSize;
        bVar17 = true;
        pvVar9 = src_01;
        if (inputSize < uVar16) goto LAB_0014f8b7;
        sVar15 = ZSTD_decompressContinue
                           (zds,zds->outBuff + zds->outStart,zds->outBuffSize - zds->outStart,
                            zds->inBuff,sVar13);
        if (0xffffffffffffff88 < sVar15) {
          return sVar15;
        }
        zds->inPos = 0;
        if ((ZVar18 == ZSTDds_skipFrame) || (sVar15 != 0)) {
          sVar13 = zds->outStart;
          sVar15 = sVar15 + sVar13;
          zds->outEnd = sVar15;
          zds->streamStage = zdss_flush;
LAB_0014fe0c:
          uVar22 = sVar15 - sVar13;
          uVar21 = (long)pvVar7 + (uVar6 - (long)local_c0);
          uVar16 = uVar22;
          if (uVar21 < uVar22) {
            uVar16 = uVar21;
          }
          if (uVar16 != 0) {
            memcpy(local_c0,zds->outBuff + sVar13,uVar16);
            sVar13 = zds->outStart;
          }
          local_c0 = (void *)((long)local_c0 + uVar16);
          *psVar1 = sVar13 + uVar16;
          bVar17 = true;
          pvVar9 = src_01;
          if (uVar22 <= uVar21) {
            zds->streamStage = zdss_read;
            bVar17 = false;
            if ((zds->outBuffSize < (zds->fParams).frameContentSize) &&
               (bVar17 = false,
               zds->outBuffSize < sVar13 + uVar16 + (ulong)(zds->fParams).blockSizeMax)) {
              *psVar1 = 0;
              zds->outEnd = 0;
              bVar17 = false;
            }
          }
          goto LAB_0014f8b7;
        }
        zds->streamStage = zdss_read;
      }
      else {
        uVar16 = (long)pvVar19 - (long)src_01;
        if (pvVar19 < src_01) {
          __assert_fail("iend >= ip",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x5fdc,
                        "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                       );
        }
        sVar15 = zds->lhSize;
        uVar21 = sVar13 - sVar15;
        if (uVar16 < uVar21) {
          if (pvVar19 != src_01) {
            memcpy(src + sVar15,src_01,uVar16);
            sVar15 = uVar16 + zds->lhSize;
            zds->lhSize = sVar15;
          }
          input->pos = input->size;
          uVar23 = (ulong)(zds->format == ZSTD_f_zstd1) * 4 + 2;
          if (sVar13 < uVar23) {
            sVar13 = uVar23;
          }
          return (sVar13 - sVar15) + 3;
        }
        if (src_01 == (void *)0x0) {
          __assert_fail("ip != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x5fe5,
                        "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                       );
        }
        memcpy(src + sVar15,src_01,uVar21);
        zds->lhSize = sVar13;
        src_01 = (void *)((long)src_01 + uVar21);
      }
LAB_0014fde7:
      bVar17 = false;
      pvVar9 = src_01;
      goto LAB_0014f8b7;
    }
  }
  return sVar13;
}

Assistant:

size_t ZSTD_decompressStream(ZSTD_DStream* zds, ZSTD_outBuffer* output, ZSTD_inBuffer* input)
{
    const char* const src = (const char*)input->src;
    const char* const istart = input->pos != 0 ? src + input->pos : src;
    const char* const iend = input->size != 0 ? src + input->size : src;
    const char* ip = istart;
    char* const dst = (char*)output->dst;
    char* const ostart = output->pos != 0 ? dst + output->pos : dst;
    char* const oend = output->size != 0 ? dst + output->size : dst;
    char* op = ostart;
    U32 someMoreWork = 1;

    DEBUGLOG(5, "ZSTD_decompressStream");
    RETURN_ERROR_IF(
        input->pos > input->size,
        srcSize_wrong,
        "forbidden. in: pos: %u   vs size: %u",
        (U32)input->pos, (U32)input->size);
    RETURN_ERROR_IF(
        output->pos > output->size,
        dstSize_tooSmall,
        "forbidden. out: pos: %u   vs size: %u",
        (U32)output->pos, (U32)output->size);
    DEBUGLOG(5, "input size : %u", (U32)(input->size - input->pos));

    while (someMoreWork) {
        switch(zds->streamStage)
        {
        case zdss_init :
            DEBUGLOG(5, "stage zdss_init => transparent reset ");
            zds->streamStage = zdss_loadHeader;
            zds->lhSize = zds->inPos = zds->outStart = zds->outEnd = 0;
            zds->legacyVersion = 0;
            zds->hostageByte = 0;
            /* fall-through */

        case zdss_loadHeader :
            DEBUGLOG(5, "stage zdss_loadHeader (srcSize : %u)", (U32)(iend - ip));
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
            if (zds->legacyVersion) {
                RETURN_ERROR_IF(zds->staticSize, memory_allocation,
                    "legacy support is incompatible with static dctx");
                {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, zds->legacyVersion, output, input);
                    if (hint==0) zds->streamStage = zdss_init;
                    return hint;
            }   }
#endif
            {   size_t const hSize = ZSTD_getFrameHeader_advanced(&zds->fParams, zds->headerBuffer, zds->lhSize, zds->format);
                DEBUGLOG(5, "header size : %u", (U32)hSize);
                if (ZSTD_isError(hSize)) {
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
                    U32 const legacyVersion = ZSTD_isLegacy(istart, iend-istart);
                    if (legacyVersion) {
                        ZSTD_DDict const* const ddict = ZSTD_getDDict(zds);
                        const void* const dict = ddict ? ZSTD_DDict_dictContent(ddict) : NULL;
                        size_t const dictSize = ddict ? ZSTD_DDict_dictSize(ddict) : 0;
                        DEBUGLOG(5, "ZSTD_decompressStream: detected legacy version v0.%u", legacyVersion);
                        RETURN_ERROR_IF(zds->staticSize, memory_allocation,
                            "legacy support is incompatible with static dctx");
                        FORWARD_IF_ERROR(ZSTD_initLegacyStream(&zds->legacyContext,
                                    zds->previousLegacyVersion, legacyVersion,
                                    dict, dictSize));
                        zds->legacyVersion = zds->previousLegacyVersion = legacyVersion;
                        {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, legacyVersion, output, input);
                            if (hint==0) zds->streamStage = zdss_init;   /* or stay in stage zdss_loadHeader */
                            return hint;
                    }   }
#endif
                    return hSize;   /* error */
                }
                if (hSize != 0) {   /* need more input */
                    size_t const toLoad = hSize - zds->lhSize;   /* if hSize!=0, hSize > zds->lhSize */
                    size_t const remainingInput = (size_t)(iend-ip);
                    assert(iend >= ip);
                    if (toLoad > remainingInput) {   /* not enough input to load full header */
                        if (remainingInput > 0) {
                            memcpy(zds->headerBuffer + zds->lhSize, ip, remainingInput);
                            zds->lhSize += remainingInput;
                        }
                        input->pos = input->size;
                        return (MAX((size_t)ZSTD_FRAMEHEADERSIZE_MIN(zds->format), hSize) - zds->lhSize) + ZSTD_blockHeaderSize;   /* remaining header bytes + next block header */
                    }
                    assert(ip != NULL);
                    memcpy(zds->headerBuffer + zds->lhSize, ip, toLoad); zds->lhSize = hSize; ip += toLoad;
                    break;
            }   }

            /* check for single-pass mode opportunity */
            if (zds->fParams.frameContentSize && zds->fParams.windowSize /* skippable frame if == 0 */
                && (U64)(size_t)(oend-op) >= zds->fParams.frameContentSize) {
                size_t const cSize = ZSTD_findFrameCompressedSize(istart, iend-istart);
                if (cSize <= (size_t)(iend-istart)) {
                    /* shortcut : using single-pass mode */
                    size_t const decompressedSize = ZSTD_decompress_usingDDict(zds, op, oend-op, istart, cSize, ZSTD_getDDict(zds));
                    if (ZSTD_isError(decompressedSize)) return decompressedSize;
                    DEBUGLOG(4, "shortcut to single-pass ZSTD_decompress_usingDDict()")
                    ip = istart + cSize;
                    op += decompressedSize;
                    zds->expected = 0;
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
            }   }

            /* Consume header (see ZSTDds_decodeFrameHeader) */
            DEBUGLOG(4, "Consume header");
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDDict(zds, ZSTD_getDDict(zds)));

            if ((MEM_readLE32(zds->headerBuffer) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {  /* skippable frame */
                zds->expected = MEM_readLE32(zds->headerBuffer + ZSTD_FRAMEIDSIZE);
                zds->stage = ZSTDds_skipFrame;
            } else {
                FORWARD_IF_ERROR(ZSTD_decodeFrameHeader(zds, zds->headerBuffer, zds->lhSize));
                zds->expected = ZSTD_blockHeaderSize;
                zds->stage = ZSTDds_decodeBlockHeader;
            }

            /* control buffer memory usage */
            DEBUGLOG(4, "Control max memory usage (%u KB <= max %u KB)",
                        (U32)(zds->fParams.windowSize >>10),
                        (U32)(zds->maxWindowSize >> 10) );
            zds->fParams.windowSize = MAX(zds->fParams.windowSize, 1U << ZSTD_WINDOWLOG_ABSOLUTEMIN);
            RETURN_ERROR_IF(zds->fParams.windowSize > zds->maxWindowSize,
                            frameParameter_windowTooLarge);

            /* Adapt buffer sizes to frame header instructions */
            {   size_t const neededInBuffSize = MAX(zds->fParams.blockSizeMax, 4 /* frame checksum */);
                size_t const neededOutBuffSize = ZSTD_decodingBufferSize_min(zds->fParams.windowSize, zds->fParams.frameContentSize);

                ZSTD_DCtx_updateOversizedDuration(zds, neededInBuffSize, neededOutBuffSize);

                {   int const tooSmall = (zds->inBuffSize < neededInBuffSize) || (zds->outBuffSize < neededOutBuffSize);
                    int const tooLarge = ZSTD_DCtx_isOversizedTooLong(zds);

                    if (tooSmall || tooLarge) {
                        size_t const bufferSize = neededInBuffSize + neededOutBuffSize;
                        DEBUGLOG(4, "inBuff  : from %u to %u",
                                    (U32)zds->inBuffSize, (U32)neededInBuffSize);
                        DEBUGLOG(4, "outBuff : from %u to %u",
                                    (U32)zds->outBuffSize, (U32)neededOutBuffSize);
                        if (zds->staticSize) {  /* static DCtx */
                            DEBUGLOG(4, "staticSize : %u", (U32)zds->staticSize);
                            assert(zds->staticSize >= sizeof(ZSTD_DCtx));  /* controlled at init */
                            RETURN_ERROR_IF(
                                bufferSize > zds->staticSize - sizeof(ZSTD_DCtx),
                                memory_allocation);
                        } else {
                            ZSTD_free(zds->inBuff, zds->customMem);
                            zds->inBuffSize = 0;
                            zds->outBuffSize = 0;
                            zds->inBuff = (char*)ZSTD_malloc(bufferSize, zds->customMem);
                            RETURN_ERROR_IF(zds->inBuff == NULL, memory_allocation);
                        }
                        zds->inBuffSize = neededInBuffSize;
                        zds->outBuff = zds->inBuff + zds->inBuffSize;
                        zds->outBuffSize = neededOutBuffSize;
            }   }   }
            zds->streamStage = zdss_read;
            /* fall-through */

        case zdss_read:
            DEBUGLOG(5, "stage zdss_read");
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompressWithInputSize(zds, iend - ip);
                DEBUGLOG(5, "neededInSize = %u", (U32)neededInSize);
                if (neededInSize==0) {  /* end of frame */
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
                }
                if ((size_t)(iend-ip) >= neededInSize) {  /* decode directly from src */
                    int const isSkipFrame = ZSTD_isSkipFrame(zds);
                    size_t const decodedSize = ZSTD_decompressContinue(zds,
                        zds->outBuff + zds->outStart, (isSkipFrame ? 0 : zds->outBuffSize - zds->outStart),
                        ip, neededInSize);
                    if (ZSTD_isError(decodedSize)) return decodedSize;
                    ip += neededInSize;
                    if (!decodedSize && !isSkipFrame) break;   /* this was just a header */
                    zds->outEnd = zds->outStart + decodedSize;
                    zds->streamStage = zdss_flush;
                    break;
            }   }
            if (ip==iend) { someMoreWork = 0; break; }   /* no more input */
            zds->streamStage = zdss_load;
            /* fall-through */

        case zdss_load:
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompress(zds);
                size_t const toLoad = neededInSize - zds->inPos;
                int const isSkipFrame = ZSTD_isSkipFrame(zds);
                size_t loadedSize;
                /* At this point we shouldn't be decompressing a block that we can stream. */
                assert(neededInSize == ZSTD_nextSrcSizeToDecompressWithInputSize(zds, iend - ip));
                if (isSkipFrame) {
                    loadedSize = MIN(toLoad, (size_t)(iend-ip));
                } else {
                    RETURN_ERROR_IF(toLoad > zds->inBuffSize - zds->inPos,
                                    corruption_detected,
                                    "should never happen");
                    loadedSize = ZSTD_limitCopy(zds->inBuff + zds->inPos, toLoad, ip, iend-ip);
                }
                ip += loadedSize;
                zds->inPos += loadedSize;
                if (loadedSize < toLoad) { someMoreWork = 0; break; }   /* not enough input, wait for more */

                /* decode loaded input */
                {   size_t const decodedSize = ZSTD_decompressContinue(zds,
                        zds->outBuff + zds->outStart, zds->outBuffSize - zds->outStart,
                        zds->inBuff, neededInSize);
                    if (ZSTD_isError(decodedSize)) return decodedSize;
                    zds->inPos = 0;   /* input is consumed */
                    if (!decodedSize && !isSkipFrame) { zds->streamStage = zdss_read; break; }   /* this was just a header */
                    zds->outEnd = zds->outStart +  decodedSize;
            }   }
            zds->streamStage = zdss_flush;
            /* fall-through */

        case zdss_flush:
            {   size_t const toFlushSize = zds->outEnd - zds->outStart;
                size_t const flushedSize = ZSTD_limitCopy(op, oend-op, zds->outBuff + zds->outStart, toFlushSize);
                op += flushedSize;
                zds->outStart += flushedSize;
                if (flushedSize == toFlushSize) {  /* flush completed */
                    zds->streamStage = zdss_read;
                    if ( (zds->outBuffSize < zds->fParams.frameContentSize)
                      && (zds->outStart + zds->fParams.blockSizeMax > zds->outBuffSize) ) {
                        DEBUGLOG(5, "restart filling outBuff from beginning (left:%i, needed:%u)",
                                (int)(zds->outBuffSize - zds->outStart),
                                (U32)zds->fParams.blockSizeMax);
                        zds->outStart = zds->outEnd = 0;
                    }
                    break;
            }   }
            /* cannot complete flush */
            someMoreWork = 0;
            break;

        default:
            assert(0);    /* impossible */
            RETURN_ERROR(GENERIC);   /* some compiler require default to do something */
    }   }

    /* result */
    input->pos = (size_t)(ip - (const char*)(input->src));
    output->pos = (size_t)(op - (char*)(output->dst));
    if ((ip==istart) && (op==ostart)) {  /* no forward progress */
        zds->noForwardProgress ++;
        if (zds->noForwardProgress >= ZSTD_NO_FORWARD_PROGRESS_MAX) {
            RETURN_ERROR_IF(op==oend, dstSize_tooSmall);
            RETURN_ERROR_IF(ip==iend, srcSize_wrong);
            assert(0);
        }
    } else {
        zds->noForwardProgress = 0;
    }
    {   size_t nextSrcSizeHint = ZSTD_nextSrcSizeToDecompress(zds);
        if (!nextSrcSizeHint) {   /* frame fully decoded */
            if (zds->outEnd == zds->outStart) {  /* output fully flushed */
                if (zds->hostageByte) {
                    if (input->pos >= input->size) {
                        /* can't release hostage (not present) */
                        zds->streamStage = zdss_read;
                        return 1;
                    }
                    input->pos++;  /* release hostage */
                }   /* zds->hostageByte */
                return 0;
            }  /* zds->outEnd == zds->outStart */
            if (!zds->hostageByte) { /* output not fully flushed; keep last byte as hostage; will be released when all output is flushed */
                input->pos--;   /* note : pos > 0, otherwise, impossible to finish reading last block */
                zds->hostageByte=1;
            }
            return 1;
        }  /* nextSrcSizeHint==0 */
        nextSrcSizeHint += ZSTD_blockHeaderSize * (ZSTD_nextInputType(zds) == ZSTDnit_block);   /* preload header of next block */
        assert(zds->inPos <= nextSrcSizeHint);
        nextSrcSizeHint -= zds->inPos;   /* part already loaded*/
        return nextSrcSizeHint;
    }
}